

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TElasticity2DAnalytic::TElasticity2DAnalytic(TElasticity2DAnalytic *this,TElasticity2DAnalytic *cp)

{
  TPZAnalyticSolution::TPZAnalyticSolution
            (&this->super_TPZAnalyticSolution,&cp->super_TPZAnalyticSolution);
  (this->super_TPZAnalyticSolution)._vptr_TPZAnalyticSolution =
       (_func_int **)&PTR__TPZAnalyticSolution_01816500;
  *(undefined4 *)&(this->super_TPZAnalyticSolution).field_0xc =
       *(undefined4 *)&(cp->super_TPZAnalyticSolution).field_0xc;
  this->fPlaneStress = 1;
  std::operator<<((ostream *)&std::cout,
                  "TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp): One should not invoke this copy constructor"
                 );
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
             ,0xb8);
}

Assistant:

TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp) : TPZAnalyticSolution(cp),fProblemType(cp.fProblemType) {
    std::cout << "TElasticity2DAnalytic::TElasticity2DAnalytic(const TElasticity2DAnalytic &cp): One should not invoke this copy constructor";
    DebugStop();
}